

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

char * __thiscall QLatin1::convertFromUnicode(QLatin1 *this,char *out,QStringView in,State *state)

{
  ushort uVar1;
  uint uVar2;
  storage_type_conflict *psVar3;
  storage_type_conflict *psVar4;
  long lVar5;
  QLatin1 QVar6;
  char *pcVar7;
  
  psVar3 = in.m_data;
  uVar2 = *(uint *)psVar3;
  psVar4 = (storage_type_conflict *)0x0;
  QVar6 = (QLatin1)0x3f;
  if ((uVar2 & 1) == 0) {
    if ((*psVar3 & L'\x02') == L'\0') {
      psVar4 = (storage_type_conflict *)0x3f;
    }
    QVar6 = SUB81(psVar4,0);
    psVar4 = psVar3;
  }
  if ((long)out < 1) {
    lVar5 = 0;
  }
  else {
    pcVar7 = (char *)0x0;
    lVar5 = 0;
    do {
      uVar1 = *(ushort *)(in.m_size + (long)pcVar7 * 2);
      if (uVar1 < 0x100) {
        this[(long)pcVar7] = SUB21(uVar1,0);
      }
      else {
        this[(long)pcVar7] = QVar6;
        lVar5 = lVar5 + 1;
      }
      pcVar7 = pcVar7 + 1;
    } while (out != pcVar7);
    this = this + (long)pcVar7;
  }
  if ((uVar2 & 1) == 0) {
    *(long *)(psVar4 + 8) = *(long *)(psVar4 + 8) + lVar5;
  }
  return (char *)this;
}

Assistant:

char *QLatin1::convertFromUnicode(char *out, QStringView in, QStringConverter::State *state) noexcept
{
    Q_ASSERT(state);
    if (state->flags & QStringConverter::Flag::Stateless) // temporary
        state = nullptr;

    const char replacement = (state && state->flags & QStringConverter::Flag::ConvertInvalidToNull) ? 0 : '?';
    qsizetype invalid = 0;
    for (qsizetype i = 0; i < in.size(); ++i) {
        if (in[i] > QChar(0xff)) {
            *out = replacement;
            ++invalid;
        } else {
            *out = (char)in[i].cell();
        }
        ++out;
    }
    if (state)
        state->invalidChars += invalid;
    return out;
}